

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::BringWindowToDisplayFront(ImGuiWindow *window)

{
  ImGuiContext *pIVar1;
  ImGuiWindow **ppIVar2;
  ImVector<ImGuiWindow_*> *this;
  ImGuiWindow *in_RDI;
  int i;
  ImGuiWindow *current_front_window;
  ImGuiContext *g;
  int in_stack_ffffffffffffffcc;
  ImVector<ImGuiWindow_*> *in_stack_ffffffffffffffd0;
  int local_1c;
  
  pIVar1 = GImGui;
  ppIVar2 = ImVector<ImGuiWindow_*>::back(in_stack_ffffffffffffffd0);
  if ((*ppIVar2 != in_RDI) && ((*ppIVar2)->RootWindow != in_RDI)) {
    for (local_1c = (pIVar1->Windows).Size + -2; -1 < local_1c; local_1c = local_1c + -1) {
      ppIVar2 = ImVector<ImGuiWindow_*>::operator[]
                          (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
      if (*ppIVar2 == in_RDI) {
        this = (ImVector<ImGuiWindow_*> *)
               ImVector<ImGuiWindow_*>::operator[]
                         (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
        ppIVar2 = ImVector<ImGuiWindow_*>::operator[](this,in_stack_ffffffffffffffcc);
        memmove(this,ppIVar2,(long)(((pIVar1->Windows).Size - local_1c) + -1) << 3);
        ppIVar2 = ImVector<ImGuiWindow_*>::operator[](this,in_stack_ffffffffffffffcc);
        *ppIVar2 = in_RDI;
        return;
      }
    }
  }
  return;
}

Assistant:

void ImGui::BringWindowToDisplayFront(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* current_front_window = g.Windows.back();
    if (current_front_window == window || current_front_window->RootWindow == window)
        return;
    for (int i = g.Windows.Size - 2; i >= 0; i--) // We can ignore the top-most window
        if (g.Windows[i] == window)
        {
            memmove(&g.Windows[i], &g.Windows[i + 1], (size_t)(g.Windows.Size - i - 1) * sizeof(ImGuiWindow*));
            g.Windows[g.Windows.Size - 1] = window;
            break;
        }
}